

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Glucose::SimpSolver::~SimpSolver(SimpSolver *this)

{
  char *pcVar1;
  uint *puVar2;
  int *piVar3;
  
  (this->super_Solver).super_Clone._vptr_Clone = (_func_int **)&PTR_clone_00123d10;
  pcVar1 = (this->eliminated).data;
  if (pcVar1 != (char *)0x0) {
    (this->eliminated).sz = 0;
    free(pcVar1);
    (this->eliminated).data = (char *)0x0;
    (this->eliminated).cap = 0;
  }
  pcVar1 = (this->frozen).data;
  if (pcVar1 != (char *)0x0) {
    (this->frozen).sz = 0;
    free(pcVar1);
    (this->frozen).data = (char *)0x0;
    (this->frozen).cap = 0;
  }
  puVar2 = (this->subsumption_queue).buf.data;
  if (puVar2 != (uint *)0x0) {
    (this->subsumption_queue).buf.sz = 0;
    free(puVar2);
    (this->subsumption_queue).buf.data = (uint *)0x0;
    (this->subsumption_queue).buf.cap = 0;
  }
  piVar3 = (this->elim_heap).indices.data;
  if (piVar3 != (int *)0x0) {
    (this->elim_heap).indices.sz = 0;
    free(piVar3);
    (this->elim_heap).indices.data = (int *)0x0;
    (this->elim_heap).indices.cap = 0;
  }
  piVar3 = (this->elim_heap).heap.data;
  if (piVar3 != (int *)0x0) {
    (this->elim_heap).heap.sz = 0;
    free(piVar3);
    (this->elim_heap).heap.data = (int *)0x0;
    (this->elim_heap).heap.cap = 0;
  }
  piVar3 = (this->n_occ).data;
  if (piVar3 != (int *)0x0) {
    (this->n_occ).sz = 0;
    free(piVar3);
    (this->n_occ).data = (int *)0x0;
    (this->n_occ).cap = 0;
  }
  piVar3 = (this->occurs).dirties.data;
  if (piVar3 != (int *)0x0) {
    (this->occurs).dirties.sz = 0;
    free(piVar3);
    (this->occurs).dirties.data = (int *)0x0;
    (this->occurs).dirties.cap = 0;
  }
  pcVar1 = (this->occurs).dirty.data;
  if (pcVar1 != (char *)0x0) {
    (this->occurs).dirty.sz = 0;
    free(pcVar1);
    (this->occurs).dirty.data = (char *)0x0;
    (this->occurs).dirty.cap = 0;
  }
  vec<Glucose::vec<unsigned_int>_>::clear(&(this->occurs).occs,true);
  pcVar1 = (this->touched).data;
  if (pcVar1 != (char *)0x0) {
    (this->touched).sz = 0;
    free(pcVar1);
    (this->touched).data = (char *)0x0;
    (this->touched).cap = 0;
  }
  puVar2 = (this->elimclauses).data;
  if (puVar2 != (uint *)0x0) {
    (this->elimclauses).sz = 0;
    free(puVar2);
    (this->elimclauses).data = (uint *)0x0;
    (this->elimclauses).cap = 0;
  }
  Solver::~Solver(&this->super_Solver);
  return;
}

Assistant:

SimpSolver::~SimpSolver()
{
}